

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

bdecode_node * __thiscall
libtorrent::bdecode_node::dict_find_string
          (bdecode_node *__return_storage_ptr__,bdecode_node *this,string_view key)

{
  type_t tVar1;
  undefined1 local_68 [8];
  bdecode_node ret;
  bdecode_node *this_local;
  string_view key_local;
  
  ret._56_8_ = this;
  dict_find((bdecode_node *)local_68,this,key);
  tVar1 = type((bdecode_node *)local_68);
  if (tVar1 == string_t) {
    bdecode_node(__return_storage_ptr__,(bdecode_node *)local_68);
  }
  else {
    memset(__return_storage_ptr__,0,0x40);
    bdecode_node(__return_storage_ptr__);
  }
  ~bdecode_node((bdecode_node *)local_68);
  return __return_storage_ptr__;
}

Assistant:

bdecode_node bdecode_node::dict_find_string(string_view key) const
	{
		bdecode_node ret = dict_find(key);
		if (ret.type() == bdecode_node::string_t)
			return ret;
		return bdecode_node();
	}